

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O0

int32_t __thiscall
icu_63::number::impl::NumberFormatterImpl::getPrefixSuffix
          (NumberFormatterImpl *this,int8_t signum,Form plural,NumberStringBuilder *outString,
          UErrorCode *status)

{
  UBool UVar1;
  ImmutablePatternModifier *this_00;
  Modifier *pMVar2;
  Modifier *modifier;
  UErrorCode *status_local;
  NumberStringBuilder *outString_local;
  Form plural_local;
  int8_t signum_local;
  NumberFormatterImpl *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this_00 = LocalPointerBase<const_icu_63::number::impl::ImmutablePatternModifier>::operator->
                        (&(this->fImmutablePatternModifier).
                          super_LocalPointerBase<const_icu_63::number::impl::ImmutablePatternModifier>
                        );
    pMVar2 = ImmutablePatternModifier::getModifier(this_00,signum,plural);
    (*pMVar2->_vptr_Modifier[2])(pMVar2,outString,0,0,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      this_local._4_4_ = (*pMVar2->_vptr_Modifier[3])();
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t NumberFormatterImpl::getPrefixSuffix(int8_t signum, StandardPlural::Form plural,
                                             NumberStringBuilder& outString, UErrorCode& status) const {
    if (U_FAILURE(status)) { return 0; }
    // #13453: DecimalFormat wants the affixes from the pattern only (modMiddle, aka pattern modifier).
    // Safe path: use fImmutablePatternModifier.
    const Modifier* modifier = fImmutablePatternModifier->getModifier(signum, plural);
    modifier->apply(outString, 0, 0, status);
    if (U_FAILURE(status)) { return 0; }
    return modifier->getPrefixLength();
}